

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Resolver.cpp
# Opt level: O2

void __thiscall
ResolverThread::resolve
          (ResolverThread *this,string *name,string *port,EventLoop *loop,ResolverHandler *handler)

{
  Logger *this_00;
  double __x;
  EventLoop *loop_local;
  _Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Liby::EventLoop_*,_std::function<void_(std::__cxx11::list<Liby::Endpoint,_std::allocator<Liby::Endpoint>_>)>_>
  local_98;
  
  loop_local = loop;
  this_00 = Liby::Logger::getLogger();
  Liby::Logger::log(this_00,__x);
  std::
  _Tuple_impl<0ul,std::__cxx11::string,std::__cxx11::string,Liby::EventLoop*,std::function<void(std::__cxx11::list<Liby::Endpoint,std::allocator<Liby::Endpoint>>)>>
  ::
  _Tuple_impl<std::__cxx11::string_const&,std::__cxx11::string_const&,Liby::EventLoop*&,std::function<void(std::__cxx11::list<Liby::Endpoint,std::allocator<Liby::Endpoint>>)>&,void>
            ((_Tuple_impl<0ul,std::__cxx11::string,std::__cxx11::string,Liby::EventLoop*,std::function<void(std::__cxx11::list<Liby::Endpoint,std::allocator<Liby::Endpoint>>)>>
              *)&local_98,name,port,&loop_local,handler);
  Liby::
  BlockingQueue<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Liby::EventLoop_*,_std::function<void_(std::__cxx11::list<Liby::Endpoint,_std::allocator<Liby::Endpoint>_>)>_>_>
  ::push_notify(&this->requests_,(const_reference_type)&local_98);
  std::
  _Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Liby::EventLoop_*,_std::function<void_(std::__cxx11::list<Liby::Endpoint,_std::allocator<Liby::Endpoint>_>)>_>
  ::~_Tuple_impl(&local_98);
  return;
}

Assistant:

void ResolverThread::resolve(const std::string &name, const std::string &port,
                             EventLoop *loop, ResolverHandler handler) {
    verbose("try to resolve %s: %s", name.data(), port.data());
    requests_.push_notify(std::make_tuple(name, port, loop, handler));
}